

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localenc.c
# Opt level: O0

int charset_from_localenc(char *name)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte *local_30;
  char *q;
  char *p;
  int i;
  char *name_local;
  
  name_local._4_4_ = charset_from_mimeenc(name);
  if ((name_local._4_4_ == 0) && (name_local._4_4_ = charset_from_xenc(name), name_local._4_4_ == 0)
     ) {
    for (p._4_4_ = 0; p._4_4_ < 0x38; p._4_4_ = p._4_4_ + 1) {
      local_30 = (byte *)localencs[p._4_4_].name;
      q = name;
      while( true ) {
        bVar3 = true;
        if (*q == '\0') {
          bVar3 = *local_30 != 0;
        }
        if (!bVar3) break;
        iVar1 = tolower((uint)(byte)*q);
        iVar2 = tolower((uint)*local_30);
        if (iVar1 != iVar2) break;
        q = q + 1;
        local_30 = local_30 + 1;
      }
      if ((*q == '\0') && (*local_30 == 0)) {
        return localencs[p._4_4_].charset;
      }
    }
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

int charset_from_localenc(const char *name)
{
    int i;

    if ( (i = charset_from_mimeenc(name)) != CS_NONE)
        return i;
    if ( (i = charset_from_xenc(name)) != CS_NONE)
        return i;

    for (i = 0; i < (int)lenof(localencs); i++) {
        const char *p, *q;
        p = name;
        q = localencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return localencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}